

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP5Writer::FlushProfiler(BP5Writer *this)

{
  int iVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_441;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpTargetNames;
  vector<char,_std::allocator<char>_> profilingJSON;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  string profileFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpBaseNames;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilersMD;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  string lineJSON;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypesMD;
  FileFStream profilingJSONStream;
  
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_
            (&transportTypes,&this->m_FileDataManager);
  uVar3 = 0xffffffffffffffff;
  lVar4 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)transportTypes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)transportTypes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    iVar1 = std::__cxx11::string::compare
                      ((long)&((transportTypes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar4,0,(char *)0x4);
    if (iVar1 == 0) {
      uVar3 = uVar2;
    }
    uVar3 = uVar3 & 0xffffffff;
    lVar4 = lVar4 + 0x20;
  }
  transportman::TransportMan::GetTransportsProfilers(&transportProfilers,&this->m_FileDataManager);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_
            (&transportTypesMD,&this->m_FileMetadataManager);
  transportman::TransportMan::GetTransportsProfilers
            (&transportProfilersMD,&this->m_FileMetadataManager);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&transportTypes,
             (const_iterator)
             transportTypes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )transportTypesMD.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )transportTypesMD.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>::
  insert<__gnu_cxx::__normal_iterator<adios2::profiling::IOChrono**,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>,void>
            ((vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>> *)
             &transportProfilers,
             (const_iterator)
             transportProfilers.
             super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              )transportProfilersMD.
               super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              )transportProfilersMD.
               super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  profiling::JSONProfiler::GetRankProfilingJSON
            ((string *)&profilingJSONStream,&this->m_Profiler,&transportTypes,&transportProfilers);
  std::operator+(&lineJSON,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &profilingJSONStream,",\n");
  std::__cxx11::string::~string((string *)&profilingJSONStream);
  profiling::JSONProfiler::AggregateProfilingJSON(&profilingJSON,&this->m_Profiler,&lineJSON);
  if ((this->super_BP5Engine).m_RankMPI == 0) {
    profileFileName._M_dataplus._M_p = (pointer)&profileFileName.field_2;
    profileFileName._M_string_length = 0;
    profileFileName.field_2._M_local_buf[0] = '\0';
    if (this->m_DrainBB == true) {
      std::__cxx11::string::string
                ((string *)&profilingJSONStream,(string *)&(this->super_Engine).m_Name);
      __l._M_len = 1;
      __l._M_array = (iterator)&profilingJSONStream;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&bpTargetNames,__l,(allocator_type *)&bpBaseNames);
      std::__cxx11::string::~string((string *)&profilingJSONStream);
      if ((int)uVar3 < 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &profilingJSONStream,
                       bpTargetNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,"_profiling.json");
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &profilingJSONStream,
                       bpTargetNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar3 & 0xffffffff),
                       "/profiling.json");
      }
      std::__cxx11::string::operator=((string *)&profileFileName,(string *)&profilingJSONStream);
      std::__cxx11::string::~string((string *)&profilingJSONStream);
      burstbuffer::FileDrainer::AddOperationWrite
                (&(this->m_FileDrainer).super_FileDrainer,&profileFileName,
                 (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                 profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&bpTargetNames);
    }
    else {
      transport::FileFStream::FileFStream(&profilingJSONStream,&(this->super_Engine).m_Comm);
      std::__cxx11::string::string((string *)&bpTargetNames,(string *)&(this->super_Engine).m_Name);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&bpTargetNames;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&bpBaseNames,__l_00,&local_441);
      std::__cxx11::string::~string((string *)&bpTargetNames);
      if ((int)uVar3 < 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bpTargetNames,
                       bpBaseNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,"_profiling.json");
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &bpTargetNames,
                       bpBaseNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar3 & 0xffffffff),
                       "/profiling.json");
      }
      std::__cxx11::string::operator=((string *)&profileFileName,(string *)&bpTargetNames);
      std::__cxx11::string::~string((string *)&bpTargetNames);
      transport::FileFStream::Open(&profilingJSONStream,&profileFileName,Write,false,false);
      transport::FileFStream::Write
                (&profilingJSONStream,
                 profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)profilingJSON.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,0xffffffffffffffff);
      transport::FileFStream::Close(&profilingJSONStream);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&bpBaseNames);
      transport::FileFStream::~FileFStream(&profilingJSONStream);
    }
    std::__cxx11::string::~string((string *)&profileFileName);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&profilingJSON.super__Vector_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&lineJSON);
  std::_Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~_Vector_base(&transportProfilersMD.
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transportTypesMD);
  std::_Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~_Vector_base(&transportProfilers.
                 super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
               );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transportTypes);
  return;
}

Assistant:

void BP5Writer::FlushProfiler()
{
    auto transportTypes = m_FileDataManager.GetTransportsTypes();

    // find first File type output, where we can write the profile
    int fileTransportIdx = -1;
    for (size_t i = 0; i < transportTypes.size(); ++i)
    {
        if (transportTypes[i].compare(0, 4, "File") == 0)
        {
            fileTransportIdx = static_cast<int>(i);
        }
    }

    auto transportProfilers = m_FileDataManager.GetTransportsProfilers();

    auto transportTypesMD = m_FileMetadataManager.GetTransportsTypes();
    auto transportProfilersMD = m_FileMetadataManager.GetTransportsProfilers();

    transportTypes.insert(transportTypes.end(), transportTypesMD.begin(), transportTypesMD.end());

    transportProfilers.insert(transportProfilers.end(), transportProfilersMD.begin(),
                              transportProfilersMD.end());

    // m_Profiler.WriteOut(transportTypes, transportProfilers);

    const std::string lineJSON(m_Profiler.GetRankProfilingJSON(transportTypes, transportProfilers) +
                               ",\n");

    const std::vector<char> profilingJSON(m_Profiler.AggregateProfilingJSON(lineJSON));

    if (m_RankMPI == 0)
    {
        // std::cout << "write profiling file!" << std::endl;
        std::string profileFileName;
        if (m_DrainBB)
        {
            // auto bpTargetNames =
            // m_BP4Serializer.GetBPBaseNames({m_Name});
            std::vector<std::string> bpTargetNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpTargetNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpTargetNames[0] + "_profiling.json";
            }
            m_FileDrainer.AddOperationWrite(profileFileName, profilingJSON.size(),
                                            profilingJSON.data());
        }
        else
        {
            transport::FileFStream profilingJSONStream(m_Comm);
            // auto bpBaseNames =
            // m_BP4Serializer.GetBPBaseNames({m_BBName});
            std::vector<std::string> bpBaseNames = {m_Name};
            if (fileTransportIdx > -1)
            {
                profileFileName = bpBaseNames[fileTransportIdx] + "/profiling.json";
            }
            else
            {
                profileFileName = bpBaseNames[0] + "_profiling.json";
            }
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
    }
}